

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddTestCommand.cxx
# Opt level: O3

bool __thiscall
cmAddTestCommand::HandleNameMode
          (cmAddTestCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  ulong uVar1;
  int iVar2;
  cmTest *pcVar3;
  cmTestGenerator *this_01;
  ostream *poVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pbVar8;
  string *psVar9;
  uint uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string name;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_228;
  string local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  uVar10 = 0;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) {
LAB_0033a71a:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8," must be given non-empty NAME.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_0033a751:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  else {
    uVar1 = 2;
    uVar7 = 1;
    do {
      uVar6 = uVar1;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar8 + uVar7));
      if (iVar2 == 0) {
        uVar10 = 1;
        if (local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_248.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8," may be given at most one COMMAND.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          goto LAB_0033a751;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar7));
        if (iVar2 == 0) {
          uVar10 = 2;
          if (local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8," may be given at most one set of CONFIGURATIONS.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
            goto LAB_0033a751;
          }
        }
        else {
          iVar2 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7));
          if (iVar2 == 0) {
            uVar10 = 3;
            if (local_1e8._M_string_length != 0) {
              local_1a8._0_8_ = local_1a8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8," may be given at most one WORKING_DIRECTORY.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
              goto LAB_0033a751;
            }
          }
          else {
            if (3 < uVar10) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," given unknown argument:\n  ",0x1b);
              pbVar8 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,pbVar8[uVar7]._M_dataplus._M_p,
                                  pbVar8[uVar7]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_208);
              goto LAB_0033a9ff;
            }
            psVar9 = &local_228;
            switch(uVar10) {
            case 1:
              uVar10 = 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_248,
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar7);
              break;
            case 2:
              uVar10 = 2;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_1c8,
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar7);
              break;
            case 3:
              psVar9 = &local_1e8;
            case 0:
              uVar10 = 4;
              std::__cxx11::string::_M_assign((string *)psVar9);
            }
          }
        }
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
    ;
    if (local_228._M_string_length == 0) goto LAB_0033a71a;
    if (local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8," must be given non-empty COMMAND.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      goto LAB_0033a751;
    }
    pcVar3 = cmMakefile::GetTest((this->super_cmCommand).Makefile,&local_228);
    if (pcVar3 == (cmTest *)0x0) {
      pcVar3 = cmMakefile::CreateTest((this->super_cmCommand).Makefile,&local_228);
      pcVar3->OldStyle = false;
      cmTest::SetCommand(pcVar3,&local_248);
      if (local_1e8._M_string_length != 0) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"WORKING_DIRECTORY","");
        cmTest::SetProperty(pcVar3,(string *)local_1a8,local_1e8._M_dataplus._M_p);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
      }
      this_00 = (this->super_cmCommand).Makefile;
      this_01 = (cmTestGenerator *)operator_new(0x88);
      cmTestGenerator::cmTestGenerator(this_01,pcVar3,&local_1c8);
      bVar5 = true;
      cmMakefile::AddTestGenerator(this_00,this_01);
      goto LAB_0033a770;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," given test NAME \"",0x12);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\" which already exists in this directory.",0x29);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_208);
LAB_0033a9ff:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar5 = false;
LAB_0033a770:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmAddTestCommand::HandleNameMode(std::vector<std::string> const& args)
{
  std::string name;
  std::vector<std::string> configurations;
  std::string working_directory;
  std::vector<std::string> command;

  // Read the arguments.
  enum Doing
  {
    DoingName,
    DoingCommand,
    DoingConfigs,
    DoingWorkingDirectory,
    DoingNone
  };
  Doing doing = DoingName;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "COMMAND") {
      if (!command.empty()) {
        this->SetError(" may be given at most one COMMAND.");
        return false;
      }
      doing = DoingCommand;
    } else if (args[i] == "CONFIGURATIONS") {
      if (!configurations.empty()) {
        this->SetError(" may be given at most one set of CONFIGURATIONS.");
        return false;
      }
      doing = DoingConfigs;
    } else if (args[i] == "WORKING_DIRECTORY") {
      if (!working_directory.empty()) {
        this->SetError(" may be given at most one WORKING_DIRECTORY.");
        return false;
      }
      doing = DoingWorkingDirectory;
    } else if (doing == DoingName) {
      name = args[i];
      doing = DoingNone;
    } else if (doing == DoingCommand) {
      command.push_back(args[i]);
    } else if (doing == DoingConfigs) {
      configurations.push_back(args[i]);
    } else if (doing == DoingWorkingDirectory) {
      working_directory = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << " given unknown argument:\n  " << args[i] << "\n";
      this->SetError(e.str());
      return false;
    }
  }

  // Require a test name.
  if (name.empty()) {
    this->SetError(" must be given non-empty NAME.");
    return false;
  }

  // Require a command.
  if (command.empty()) {
    this->SetError(" must be given non-empty COMMAND.");
    return false;
  }

  // Require a unique test name within the directory.
  if (this->Makefile->GetTest(name)) {
    std::ostringstream e;
    e << " given test NAME \"" << name
      << "\" which already exists in this directory.";
    this->SetError(e.str());
    return false;
  }

  // Add the test.
  cmTest* test = this->Makefile->CreateTest(name);
  test->SetOldStyle(false);
  test->SetCommand(command);
  if (!working_directory.empty()) {
    test->SetProperty("WORKING_DIRECTORY", working_directory.c_str());
  }
  this->Makefile->AddTestGenerator(new cmTestGenerator(test, configurations));

  return true;
}